

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

bool slang::ast::AssertionInstanceExpression::checkAssertionArg
               (PropertyExprSyntax *propExpr,AssertionPortSymbol *formal,ASTContext *context,
               ActualArg *result,bool isRecursiveProp)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  bool bVar1;
  __optional_eq_t<slang::ast::ArgumentDirection,_slang::ast::ArgumentDirection> _Var2;
  int iVar3;
  Type *pTVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Scope *pSVar5;
  Symbol *pSVar6;
  socklen_t __len;
  void *in_RDX;
  Symbol *in_RSI;
  undefined8 in_RDI;
  byte in_R8B;
  Symbol *sym;
  Scope *formalParent;
  Expression *bound;
  TimingControl *bound_5;
  AssertionExpr *bound_4;
  AssertionExpr *bound_3;
  AssertionExpr *bound_2;
  Expression *bound_1;
  Type *type;
  type expr;
  ASTContext ctx;
  type *regExpr;
  type *seqExpr;
  Symbol *in_stack_00000240;
  Expression *in_stack_00000248;
  DriverKind in_stack_00000257;
  ValueSymbol *in_stack_00000258;
  bitmask<slang::ast::AssignFlags> in_stack_00000267;
  ASTContext *in_stack_fffffffffffffe18;
  Type *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  Type *in_stack_fffffffffffffe38;
  SourceLocation in_stack_fffffffffffffe40;
  SourceLocation this;
  SourceLocation in_stack_fffffffffffffe48;
  SourceLocation SVar7;
  undefined8 in_stack_fffffffffffffe50;
  DiagCode code;
  undefined8 in_stack_fffffffffffffe60;
  undefined1 allowPacked;
  Type *in_stack_fffffffffffffe68;
  Diagnostic *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  bitmask<slang::ast::ASTFlags> local_148;
  undefined8 local_140;
  SourceRange local_138;
  undefined4 local_124;
  TimingControl *local_120;
  TimingControl *local_118;
  AssertionExpr *local_110;
  AssertionExpr *local_108;
  AssertionExpr *local_100;
  AssertionExpr *local_f8;
  SourceRange local_f0;
  undefined4 local_dc;
  AssertionExpr *local_d8;
  AssertionExpr *local_d0;
  bitmask<slang::ast::ASTFlags> local_c8;
  undefined8 local_c0;
  bitmask<slang::ast::ASTFlags> local_b8;
  undefined8 local_b0;
  SourceLocation local_a8;
  bitmask<slang::ast::ASTFlags> local_a0;
  SourceLocation local_98;
  bitmask<slang::ast::ASTFlags> local_90;
  sockaddr local_88;
  bitmask<slang::ast::ASTFlags> abStack_78 [5];
  SourceLocation *local_50;
  __tuple_element_t<0UL,_tuple<const_SequenceExprSyntax_*,_const_ExpressionSyntax_*>_> *local_48;
  byte local_29;
  void *local_20;
  Symbol *local_18;
  undefined8 local_10;
  bool local_1;
  
  local_29 = in_R8B & 1;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  decomposePropExpr((PropertyExprSyntax *)in_stack_fffffffffffffe38);
  local_48 = std::
             get<0ul,slang::syntax::SequenceExprSyntax_const*,slang::syntax::ExpressionSyntax_const*>
                       ((tuple<const_slang::syntax::SequenceExprSyntax_*,_const_slang::syntax::ExpressionSyntax_*>
                         *)0xf1ddd5);
  local_50 = (SourceLocation *)
             std::
             get<1ul,slang::syntax::SequenceExprSyntax_const*,slang::syntax::ExpressionSyntax_const*>
                       ((tuple<const_slang::syntax::SequenceExprSyntax_*,_const_slang::syntax::ExpressionSyntax_*>
                         *)0xf1ddea);
  memcpy(&local_88,local_20,0x38);
  code = SUB84((ulong)in_stack_fffffffffffffe50 >> 0x20,0);
  allowPacked = (undefined1)((ulong)in_stack_fffffffffffffe60 >> 0x38);
  if ((local_29 & 1) != 0) {
    bVar1 = AssertionPortSymbol::isLocalVar((AssertionPortSymbol *)0xf1de27);
    allowPacked = (undefined1)((ulong)in_stack_fffffffffffffe60 >> 0x38);
    if (!bVar1) {
      if (*local_50 == (SourceLocation)0x0) {
        bitmask<slang::ast::ASTFlags>::bitmask(&local_90,RecursivePropertyArg);
        bitmask<slang::ast::ASTFlags>::operator|=(abStack_78,&local_90);
      }
      else {
        local_98 = *local_50;
        while( true ) {
          allowPacked = (undefined1)((ulong)in_stack_fffffffffffffe60 >> 0x38);
          if (*(int *)local_98 != 0x167) break;
          slang::syntax::SyntaxNode::as<slang::syntax::ParenthesizedExpressionSyntax>
                    ((SyntaxNode *)local_98);
          local_98 = (SourceLocation)
                     not_null::operator_cast_to_ExpressionSyntax_
                               ((not_null<slang::syntax::ExpressionSyntax_*> *)0xf1dea9);
        }
        if (*(int *)local_98 != 0xe5) {
          bitmask<slang::ast::ASTFlags>::bitmask(&local_a0,RecursivePropertyArg);
          bitmask<slang::ast::ASTFlags>::operator|=(abStack_78,&local_a0);
        }
      }
    }
  }
  local_a8 = (SourceLocation)
             DeclaredType::getType
                       ((DeclaredType *)
                        CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  pTVar4 = Type::getCanonicalType(in_stack_fffffffffffffe20);
  switch((pTVar4->super_Symbol).kind) {
  case EventType:
    iVar3 = TimingControl::bind((int)local_10,&local_88,__len);
    local_120 = (TimingControl *)CONCAT44(extraout_var_03,iVar3);
    local_118 = local_120;
    std::
    variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
    ::operator=((variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                 *)in_stack_fffffffffffffe40,(TimingControl **)in_stack_fffffffffffffe38);
    bVar1 = TimingControl::bad(local_118);
    local_1 = (bool)((bVar1 ^ 0xffU) & 1);
    break;
  default:
    if (*local_50 == (SourceLocation)0x0) {
      local_124 = 0x20007;
      local_138 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffe70);
      sourceRange_00.endLoc = in_stack_fffffffffffffe48;
      sourceRange_00.startLoc = in_stack_fffffffffffffe40;
      ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffe38,code,sourceRange_00);
      ast::operator<<(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      return false;
    }
    SVar7 = *local_50;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_148,None);
    iVar3 = Expression::bind(SVar7._0_4_,&local_88,(socklen_t)local_148.m_bits);
    local_140 = CONCAT44(extraout_var_04,iVar3);
    bVar1 = Expression::bad((Expression *)in_stack_fffffffffffffe20);
    if (bVar1) {
      return false;
    }
    this = local_a8;
    not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0xf1e325);
    bVar1 = Type::isCastCompatible
                      (in_stack_fffffffffffffe38,
                       (Type *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
    if (!bVar1) {
      slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffe70);
      sourceRange_01.endLoc = SVar7;
      sourceRange_01.startLoc = this;
      ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffe38,code,sourceRange_01);
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0xf1e39e);
      ast::operator<<(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      ast::operator<<(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      return false;
    }
    pSVar5 = Symbol::getParentScope(local_18);
    _Var2 = std::operator==((optional<slang::ast::ArgumentDirection> *)in_stack_fffffffffffffe20,
                            (ArgumentDirection *)in_stack_fffffffffffffe18);
    if (_Var2) {
LAB_00f1e434:
      pSVar6 = Scope::asSymbol(pSVar5);
      bVar1 = pSVar6->kind != Checker;
    }
    else {
      _Var2 = std::operator==((optional<slang::ast::ArgumentDirection> *)in_stack_fffffffffffffe20,
                              (ArgumentDirection *)in_stack_fffffffffffffe18);
      bVar1 = false;
      if (_Var2) goto LAB_00f1e434;
    }
    if (bVar1) {
      pSVar6 = Expression::getSymbolReference
                         ((Expression *)in_stack_fffffffffffffe68,(bool)allowPacked);
      if ((pSVar6 == (Symbol *)0x0) || (pSVar6->kind != LocalAssertionVar)) {
        sourceRange_02.endLoc = SVar7;
        sourceRange_02.startLoc = this;
        ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffe38,code,sourceRange_02);
        return false;
      }
      Symbol::as<slang::ast::ValueSymbol>((Symbol *)0xf1e4d7);
      pSVar5 = not_null<const_slang::ast::Scope_*>::operator->
                         ((not_null<const_slang::ast::Scope_*> *)0xf1e4f5);
      Scope::asSymbol(pSVar5);
      bitmask<slang::ast::AssignFlags>::bitmask
                ((bitmask<slang::ast::AssignFlags> *)&stack0xfffffffffffffe6f,
                 AssertionLocalVarFormalArg);
      ValueSymbol::addDriver
                (in_stack_00000258,in_stack_00000257,in_stack_00000248,in_stack_00000240,
                 in_stack_00000267);
    }
    std::
    variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
    ::operator=((variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                 *)this,(Expression **)in_stack_fffffffffffffe38);
    local_1 = true;
    break;
  case UntypedType:
    if (*local_50 == (SourceLocation)0x0) {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_c8,AssertionInstanceArgCheck);
      bitmask<slang::ast::ASTFlags>::operator|=(abStack_78,&local_c8);
      iVar3 = AssertionExpr::bind((int)local_10,&local_88,0);
      local_d8 = (AssertionExpr *)CONCAT44(extraout_var_00,iVar3);
      local_d0 = local_d8;
      std::
      variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
      ::operator=((variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   *)in_stack_fffffffffffffe40,(AssertionExpr **)in_stack_fffffffffffffe38);
      bVar1 = AssertionExpr::bad(local_d0);
      local_1 = (bool)((bVar1 ^ 0xffU) & 1);
    }
    else {
      SVar7 = *local_50;
      bitmask<slang::ast::ASTFlags>::bitmask(&local_b8,AllowUnboundedLiteral);
      iVar3 = Expression::bind(SVar7._0_4_,&local_88,(socklen_t)local_b8.m_bits);
      local_c0 = CONCAT44(extraout_var,iVar3);
      local_b0 = local_c0;
      std::
      variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
      ::operator=((variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   *)in_stack_fffffffffffffe40,(Expression **)in_stack_fffffffffffffe38);
      bVar1 = Expression::bad((Expression *)in_stack_fffffffffffffe20);
      local_1 = (bool)((bVar1 ^ 0xffU) & 1);
    }
    break;
  case SequenceType:
    if (*local_48 ==
        (__tuple_element_t<0UL,_tuple<const_SequenceExprSyntax_*,_const_ExpressionSyntax_*>_>)0x0) {
      local_dc = 0x40007;
      local_f0 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffe70);
      sourceRange.endLoc = in_stack_fffffffffffffe48;
      sourceRange.startLoc = in_stack_fffffffffffffe40;
      ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffe38,code,sourceRange);
      local_1 = false;
    }
    else {
      iVar3 = AssertionExpr::bind((int)*local_48,&local_88,0);
      local_f8 = (AssertionExpr *)CONCAT44(extraout_var_01,iVar3);
      bVar1 = AssertionExpr::bad(local_f8);
      if (bVar1) {
        local_1 = false;
      }
      else {
        AssertionExpr::requireSequence
                  ((AssertionExpr *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        local_100 = local_f8;
        std::
        variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
        ::operator=((variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                     *)in_stack_fffffffffffffe40,(AssertionExpr **)in_stack_fffffffffffffe38);
        local_1 = true;
      }
    }
    break;
  case PropertyType:
    iVar3 = AssertionExpr::bind((int)local_10,&local_88,0);
    local_110 = (AssertionExpr *)CONCAT44(extraout_var_02,iVar3);
    local_108 = local_110;
    std::
    variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
    ::operator=((variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                 *)in_stack_fffffffffffffe40,(AssertionExpr **)in_stack_fffffffffffffe38);
    bVar1 = AssertionExpr::bad(local_108);
    local_1 = (bool)((bVar1 ^ 0xffU) & 1);
    break;
  case ErrorType:
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool AssertionInstanceExpression::checkAssertionArg(const PropertyExprSyntax& propExpr,
                                                    const AssertionPortSymbol& formal,
                                                    const ASTContext& context, ActualArg& result,
                                                    bool isRecursiveProp) {
    auto [seqExpr, regExpr] = decomposePropExpr(propExpr);

    ASTContext ctx = context;
    if (isRecursiveProp && !formal.isLocalVar()) {
        // For every recursive instance of property q in the declaration of property p,
        // each actual argument expression e of the instance must satisfy at least one
        // of the following conditions:
        // 1. e is itself a formal argument of p.
        // 2. No formal argument of p appears in e.
        // 3. e is bound to a local variable formal argument of q.
        if (!regExpr)
            ctx.flags |= ASTFlags::RecursivePropertyArg;
        else {
            auto expr = regExpr;
            while (expr->kind == SyntaxKind::ParenthesizedExpression)
                expr = expr->as<ParenthesizedExpressionSyntax>().expression;

            // This check filters out cases where the entire argument is a formal argument.
            if (expr->kind != SyntaxKind::IdentifierName)
                ctx.flags |= ASTFlags::RecursivePropertyArg;
        }
    }

    auto& type = formal.declaredType.getType();
    switch (type.getCanonicalType().kind) {
        case SymbolKind::UntypedType:
            // Untyped formals allow everything. Bind here just so we notice things like
            // name resolution errors even if the argument ends up being unused in the
            // body of the sequence / property.
            if (regExpr) {
                auto& bound = Expression::bind(*regExpr, ctx, ASTFlags::AllowUnboundedLiteral);
                result = &bound;
                return !bound.bad();
            }
            else {
                ctx.flags |= ASTFlags::AssertionInstanceArgCheck;
                auto& bound = AssertionExpr::bind(propExpr, ctx);
                result = &bound;
                return !bound.bad();
            }
        case SymbolKind::SequenceType: {
            if (!seqExpr) {
                ctx.addDiag(diag::AssertionArgTypeSequence, propExpr.sourceRange());
                return false;
            }

            auto& bound = AssertionExpr::bind(*seqExpr, ctx);
            if (bound.bad())
                return false;

            bound.requireSequence(ctx);
            result = &bound;
            return true;
        }
        case SymbolKind::PropertyType: {
            auto& bound = AssertionExpr::bind(propExpr, ctx);
            result = &bound;
            return !bound.bad();
        }
        case SymbolKind::EventType: {
            auto& bound = TimingControl::bind(propExpr, ctx);
            result = &bound;
            return !bound.bad();
        }
        case SymbolKind::ErrorType:
            return false;
        default:
            break;
    }

    // For all other types, we need a normal expression that
    // is cast compatible with the target type.
    if (!regExpr) {
        ctx.addDiag(diag::AssertionArgNeedsRegExpr, propExpr.sourceRange()) << type;
        return false;
    }

    auto& bound = Expression::bind(*regExpr, ctx);
    if (bound.bad())
        return false;

    if (!type.isCastCompatible(*bound.type)) {
        ctx.addDiag(diag::AssertionArgTypeMismatch, propExpr.sourceRange()) << *bound.type << type;
        return false;
    }

    auto formalParent = formal.getParentScope();
    SLANG_ASSERT(formalParent);

    // Local var formals that are output or inout must bind only to another local var.
    if ((formal.direction == ArgumentDirection::InOut ||
         formal.direction == ArgumentDirection::Out) &&
        formalParent->asSymbol().kind != SymbolKind::Checker) {
        auto sym = bound.getSymbolReference();
        if (!sym || sym->kind != SymbolKind::LocalAssertionVar) {
            ctx.addDiag(diag::AssertionOutputLocalVar, bound.sourceRange);
            return false;
        }

        sym->as<ValueSymbol>().addDriver(DriverKind::Procedural, bound, context.scope->asSymbol(),
                                         AssignFlags::AssertionLocalVarFormalArg);
    }

    result = &bound;
    return true;
}